

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QVariant * qDateFromString(QString *val)

{
  long lVar1;
  bool bVar2;
  QDate QVar3;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *this;
  QString *in_stack_ffffffffffffffd8;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x10bdd2);
  if (bVar2) {
    QDate::QDate((QDate *)this);
    QVariant::QVariant(in_RDI,local_10);
  }
  else {
    QVar3 = QDate::fromString(in_stack_ffffffffffffffd8,(DateFormat)((ulong)this >> 0x20));
    QVariant::QVariant(in_RDI,QVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

static inline QVariant qDateFromString(const QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QDate());
    return QVariant(QDate::fromString(val, Qt::ISODate));
#endif
}